

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::matchesFilters
               (vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *filters,
               TestCase *testCase)

{
  bool bVar1;
  const_iterator __lhs;
  const_iterator __rhs;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *in_stack_ffffffffffffffd8
  ;
  
  __lhs = std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::begin
                    (in_stack_ffffffffffffffd8);
  __rhs = std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::end
                    (in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
                        *)__rhs._M_current);
    if (!bVar1) {
      return true;
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
    ::operator->((__normal_iterator<const_Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
                  *)&stack0xffffffffffffffe0);
    bVar1 = TestCaseFilters::shouldInclude((TestCaseFilters *)filters,testCase);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
    ::operator++((__normal_iterator<const_Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  return false;
}

Assistant:

inline bool matchesFilters( std::vector<TestCaseFilters> const& filters, TestCase const& testCase ) {
        std::vector<TestCaseFilters>::const_iterator it = filters.begin();
        std::vector<TestCaseFilters>::const_iterator itEnd = filters.end();
        for(; it != itEnd; ++it )
            if( !it->shouldInclude( testCase ) )
                return false;
        return true;
    }